

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void disas_clr(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  int opsize;
  TCGContext_conflict2 *tcg_ctx;
  TCGv_i32 val;
  TCGv_i32 pTVar1;
  uintptr_t o;
  
  tcg_ctx = s->uc->tcg_ctx;
  val = tcg_const_i32_m68k(tcg_ctx,0);
  opsize = *(int *)(&DAT_00d886a4 + (insn >> 4 & 0xc));
  pTVar1 = gen_ea_mode(env,s,insn >> 3 & 7,insn & 7,opsize,val,(TCGv_i32 *)0x0,EA_STORE,
                       (uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
  if (pTVar1 != tcg_ctx->NULL_QREG) {
    gen_logic_cc(s,val,opsize);
    tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(val + (long)tcg_ctx));
    return;
  }
  gen_exception(s,(s->base).pc_next,3);
  return;
}

Assistant:

DISAS_INSN(clr)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int opsize;
    TCGv zero;

    zero = tcg_const_i32(tcg_ctx, 0);

    opsize = insn_opsize(insn);
    DEST_EA(env, insn, opsize, zero, NULL);
    gen_logic_cc(s, zero, opsize);
    tcg_temp_free(tcg_ctx, zero);
}